

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O0

string * __thiscall helics::PublicationInfo::getTargets_abi_cxx11_(PublicationInfo *this)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  SubscriberInformation *sub;
  const_iterator __end4;
  const_iterator __begin4;
  vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_> *__range4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  char cVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  _Alloc_hider in_stack_ffffffffffffffb8;
  __normal_iterator<const_helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
  local_18;
  pointer *local_10;
  
  cVar4 = (char)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4de3ef);
  if ((bVar1) &&
     (bVar1 = std::
              vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
              ::empty((vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                       *)in_RDI), !bVar1)) {
    sVar2 = std::
            vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::
            size((vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                  *)&in_RDI->_M_string_length);
    if (sVar2 == 1) {
      std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::
      front((vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_> *
            )in_stack_ffffffffffffff90);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(in_RDI,cVar4);
      local_10 = (pointer *)&in_RDI->_M_string_length;
      local_18._M_current =
           (SubscriberInformation *)
           std::
           vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::
           begin((vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                  *)in_stack_ffffffffffffff88);
      std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::
      end((vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_> *)
          in_stack_ffffffffffffff88);
      while (bVar1 = __gnu_cxx::
                     operator==<const_helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
                               ((__normal_iterator<const_helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
                                 *)in_stack_ffffffffffffff90,
                                (__normal_iterator<const_helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
                                 *)in_stack_ffffffffffffff88), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<const_helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
        ::operator*(&local_18);
        in_stack_ffffffffffffff90 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&in_RDI[7].field_2 + 8);
        __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &stack0xffffffffffffffb8;
        generateJsonQuotedString((string *)in_stack_ffffffffffffffb8._M_p);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (in_RDI,__str);
        cVar4 = (char)((ulong)__str >> 0x38);
        std::__cxx11::string::~string(in_stack_ffffffffffffff90);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(in_RDI,cVar4);
        __gnu_cxx::
        __normal_iterator<const_helics::SubscriberInformation_*,_std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>_>
        ::operator++(&local_18);
      }
      pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffff90);
      *pvVar3 = ']';
    }
  }
  return (string *)((long)&in_RDI[7].field_2 + 8);
}

Assistant:

const std::string& PublicationInfo::getTargets() const
{
    if (destTargets.empty()) {
        if (!subscribers.empty()) {
            if (subscribers.size() == 1) {
                destTargets = subscribers.front().key;
            } else {
                destTargets.push_back('[');
                for (const auto& sub : subscribers) {
                    destTargets.append(generateJsonQuotedString(sub.key));
                    destTargets.push_back(',');
                }
                destTargets.back() = ']';
            }
        }
    }
    return destTargets;
}